

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_basic.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ulong uVar2;
  uint local_24;
  char *pcStack_20;
  uint seed;
  char *dir;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  dir = (char *)argv;
  argv_local._0_4_ = argc;
  if (argc < 2) {
    fprintf(_stderr,"usage: %s dir-name\n",*argv);
    exit(-1);
  }
  pcStack_20 = argv[1];
  if (argc == 3) {
    iVar1 = str_to_unsigned(argv[2],&local_24);
    if ((iVar1 != 0) || (local_24 == 0)) {
      fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
              "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
              ,0x50a,"main");
      fprintf(_stderr,"incorrect value of seed: %s",*(undefined8 *)(dir + 0x10));
      fprintf(_stderr,"\n");
      abort();
    }
  }
  else {
    uVar2 = time((time_t *)0x0);
    local_24 = (uint)uVar2;
    printf("seed: %u\n",uVar2 & 0xffffffff);
  }
  test_new_delete(pcStack_20,*(char **)dir,VMEMCACHE_REPLACEMENT_NONE);
  test_new_delete(pcStack_20,*(char **)dir,VMEMCACHE_REPLACEMENT_LRU);
  test_put_get_evict(pcStack_20,VMEMCACHE_REPLACEMENT_NONE);
  test_put_get_evict(pcStack_20,VMEMCACHE_REPLACEMENT_LRU);
  test_get_with_offset(pcStack_20);
  test_evict(pcStack_20,VMEMCACHE_REPLACEMENT_LRU);
  test_memory_leaks(pcStack_20,0,VMEMCACHE_REPLACEMENT_LRU,local_24);
  test_memory_leaks(pcStack_20,1,VMEMCACHE_REPLACEMENT_LRU,local_24);
  test_merge_allocations(pcStack_20,VMEMCACHE_REPLACEMENT_NONE);
  test_merge_allocations(pcStack_20,VMEMCACHE_REPLACEMENT_LRU);
  test_put_in_evict(pcStack_20,VMEMCACHE_REPLACEMENT_LRU,local_24);
  test_offsets(pcStack_20,VMEMCACHE_REPLACEMENT_LRU);
  test_offsets(pcStack_20,VMEMCACHE_REPLACEMENT_NONE);
  test_vmemcache_get_stat(pcStack_20);
  test_data_integrity(pcStack_20,local_24);
  return 0;
}

Assistant:

int
main(int argc, char *argv[])
{
	if (argc < 2) {
		fprintf(stderr, "usage: %s dir-name\n", argv[0]);
		exit(-1);
	}
	const char *dir = argv[1];

	unsigned seed;
	if (argc == 3) {
		if (str_to_unsigned(argv[2], &seed) || seed < 1)
			UT_FATAL("incorrect value of seed: %s", argv[2]);
	} else {
		seed = (unsigned)time(NULL);
		printf("seed: %u\n", seed);
	}

	test_new_delete(dir, argv[0], VMEMCACHE_REPLACEMENT_NONE);
	test_new_delete(dir, argv[0], VMEMCACHE_REPLACEMENT_LRU);

	test_put_get_evict(dir, VMEMCACHE_REPLACEMENT_NONE);
	test_put_get_evict(dir, VMEMCACHE_REPLACEMENT_LRU);

	test_get_with_offset(dir);

	test_evict(dir, VMEMCACHE_REPLACEMENT_LRU);

	/* '0' means: key size < 1kB */
	test_memory_leaks(dir, 0, VMEMCACHE_REPLACEMENT_LRU, seed);

	/* '1' means: key size > 1kB */
	test_memory_leaks(dir, 1, VMEMCACHE_REPLACEMENT_LRU, seed);

	test_merge_allocations(dir, VMEMCACHE_REPLACEMENT_NONE);
	test_merge_allocations(dir, VMEMCACHE_REPLACEMENT_LRU);

	test_put_in_evict(dir, VMEMCACHE_REPLACEMENT_LRU, seed);

	test_offsets(dir, VMEMCACHE_REPLACEMENT_LRU);
	test_offsets(dir, VMEMCACHE_REPLACEMENT_NONE);

	test_vmemcache_get_stat(dir);

	test_data_integrity(dir, seed);

	return 0;
}